

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::object::write_full_size<std::wostream,pstore::dump::object_wchar_traits>
          (object *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,indent *ind,
          object_strings<pstore::dump::object_wchar_traits> *strings)

{
  char cVar1;
  pointer pmVar2;
  unsigned_long uVar3;
  element_type *peVar4;
  pointer ptVar5;
  int iVar6;
  wostream *pwVar7;
  undefined4 extraout_var;
  ulong uVar8;
  pointer ptVar9;
  pointer p;
  indent next_indent;
  vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  kvps;
  __shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __tuple_element_t<1UL,_tuple<shared_ptr<value>,_shared_ptr<value>,_unsigned_long>_> value;
  string_type sep;
  size_t key_length;
  undefined1 local_60 [16];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  kvps.
  super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  kvps.
  super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  kvps.
  super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ::reserve(&kvps,((long)(this->members_).
                         super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->members_).
                        super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  pmVar2 = (this->members_).
           super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = 0;
  for (p = (this->members_).
           super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
           ._M_impl.super__Vector_impl_data._M_start;
      ptVar5 = kvps.
               super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, p != pmVar2; p = p + 1) {
    key_length = property_length<wchar_t>(&p->property);
    if (uVar8 <= key_length) {
      uVar8 = key_length;
    }
    property((object *)&sep,&p->property);
    std::
    vector<std::tuple<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>,std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>>>
    ::
    emplace_back<std::shared_ptr<pstore::dump::string>,std::shared_ptr<pstore::dump::value>const&,unsigned_long_const&>
              ((vector<std::tuple<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>,std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>>>
                *)&kvps,(shared_ptr<pstore::dump::string> *)&sep,&p->val,&key_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sep._M_string_length);
  }
  sep._M_dataplus._M_p = (pointer)&sep.field_2;
  sep._M_string_length = 0;
  sep.field_2._M_local_buf[0] = L'\0';
  next_indent.count_ = ind->count_ + 4;
  for (ptVar9 = kvps.
                super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar9 != ptVar5; ptVar9 = ptVar9 + 1) {
    uVar3 = (ptVar9->
            super__Tuple_impl<0UL,_std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
            ).super__Tuple_impl<1UL,_std::shared_ptr<pstore::dump::value>,_unsigned_long>.
            super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
            _M_head_impl;
    pwVar7 = std::operator<<(os,(wstring *)&sep);
    peVar4 = (ptVar9->
             super__Tuple_impl<0UL,_std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
             ).super__Head_base<0UL,_std::shared_ptr<pstore::dump::value>,_false>._M_head_impl.
             super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar4->_vptr_value[0x14])(peVar4,pwVar7);
    key_length = (size_t)local_60;
    std::__cxx11::wstring::_M_construct((ulong)&key_length,((int)uVar8 + 1) - (int)uVar3);
    pwVar7 = std::operator<<(pwVar7,(wstring *)&key_length);
    std::operator<<(pwVar7,(wstring *)&strings->colon_space_str);
    std::__cxx11::wstring::~wstring((wstring *)&key_length);
    std::__shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&value.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2> *)
               &(ptVar9->
                super__Tuple_impl<0UL,_std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
                ).super__Tuple_impl<1UL,_std::shared_ptr<pstore::dump::value>,_unsigned_long>.
                super__Head_base<1UL,_std::shared_ptr<pstore::dump::value>,_false>);
    std::__shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b0,&value.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)
    ;
    iVar6 = (*(local_b0._M_ptr)->_vptr_value[2])();
    if (CONCAT44(extraout_var,iVar6) == 0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
    }
    else {
      cVar1 = *(char *)(CONCAT44(extraout_var,iVar6) + 0x20);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
      if (cVar1 == '\0') {
        pwVar7 = std::operator<<(os,(wstring *)&strings->cr_str);
        dump::operator<<(pwVar7,&next_indent);
      }
    }
    (*(value.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_value[0x16])
              (value.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr,os,
               &next_indent);
    indent::str<wchar_t>(&local_50,ind);
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &key_length,&strings->cr_str,&local_50);
    std::__cxx11::wstring::operator=((wstring *)&sep,(wstring *)&key_length);
    std::__cxx11::wstring::~wstring((wstring *)&key_length);
    std::__cxx11::wstring::~wstring((wstring *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&value.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__cxx11::wstring::~wstring((wstring *)&sep);
  std::
  vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ::~vector(&kvps);
  return os;
}

Assistant:

OStream &
        object::write_full_size (OStream & os, indent const & ind,
                                 object_strings<ObjectCharacterTraits> const & strings) const {
            using char_type = typename OStream::char_type;
            using string_type = std::basic_string<char_type>;

            // Proceed in two phases: the first measures the length of all of the object keys to
            // find the longest. This enables the values to be nicely aligned by inserting the
            // correct horizontal spacing.
            enum { key_index, value_index, key_length_index };
            std::vector<std::tuple<value_ptr, value_ptr, std::size_t>> kvps;
            kvps.reserve (members_.size ());

            auto longest = std::size_t{0};
            for (object::member const & kvp : members_) {
                std::size_t const key_length = object::property_length<char_type> (kvp.property);
                longest = std::max (longest, key_length);
                kvps.emplace_back (object::property (kvp.property), kvp.val, key_length);
            }

            // The second phase: produce the keys and values with the correct number of spaces
            // between them.
            string_type sep;
            indent next_indent = ind.next (4);

            auto const needs_new_line = [] (value_ptr const value) {
                object const * const obj = value->dynamic_cast_object ();
                return obj != nullptr && !obj->is_compact ();
            };

            for (auto const & a : kvps) {
                std::size_t const num_spaces = longest - std::get<key_length_index> (a) + 1U;
                os << sep << (*std::get<key_index> (a))
                   << string_type (num_spaces, strings.space_str[0]) << strings.colon_space_str;

                // If the value is an object then we may need to insert a new line here.
                auto const value = std::get<value_index> (a);
                if (needs_new_line (value)) {
                    os << strings.cr_str << next_indent;
                }
                value->write_impl (os, next_indent);

                sep = strings.cr_str + ind.str<char_type> ();
            }
            return os;
        }